

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16LE(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  iVar6 = (int)out;
  iVar7 = (int)in;
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar7 = 0;
      iVar1 = 0;
    }
    else {
      if (0 < (long)*inlen) {
        pbVar8 = in + *inlen;
        pbVar9 = out + ((long)*outlen & 0xfffffffffffffffe);
        do {
          bVar4 = *in;
          if ((char)bVar4 < '\0') {
            if (bVar4 < 0xe0) {
              if (bVar4 < 0xc2) {
                iVar1 = -2;
                goto LAB_0012dc63;
              }
              uVar12 = bVar4 & 0x1f;
              uVar10 = 0x80;
              lVar11 = 2;
            }
            else {
              lVar11 = 4 - (ulong)(bVar4 < 0xf0);
              uVar10 = 0x10000;
              if (bVar4 < 0xf0) {
                uVar10 = 0x800;
              }
              uVar12 = bVar4 & 0xf;
            }
            if (lVar11 <= (long)pbVar8 - (long)in) {
              lVar2 = 1;
              do {
                uVar13 = uVar12;
                iVar1 = -2;
                if ((in[lVar2] & 0xc0) != 0x80) goto LAB_0012dc63;
                uVar5 = uVar13 << 6;
                uVar12 = in[lVar2] & 0x3f | uVar5;
                lVar2 = lVar2 + 1;
              } while (lVar11 != lVar2);
              if (((uVar10 <= uVar12) && (uVar5 < 0x110000)) && ((uVar13 & 0x3ffffe0) != 0x360)) {
                bVar4 = (byte)(uVar5 >> 8);
                if (uVar5 < 0x10000) {
                  if (out < pbVar9) {
                    *out = (byte)uVar12;
                    lVar2 = 2;
                    lVar3 = 1;
LAB_0012dc4b:
                    out[lVar3] = bVar4;
                    out = out + lVar2;
                    in = in + lVar11;
                    goto LAB_0012dc55;
                  }
                }
                else if (3 < (long)pbVar9 - (long)out) {
                  *out = (byte)(uVar12 - 0x10000 >> 10);
                  out[1] = (byte)(uVar12 - 0x10000 >> 0x12) | 0xd8;
                  out[2] = (byte)uVar12;
                  bVar4 = bVar4 & 3 | 0xdc;
                  lVar2 = 4;
                  lVar3 = 3;
                  goto LAB_0012dc4b;
                }
LAB_0012dc87:
                iVar1 = -3;
              }
              goto LAB_0012dc63;
            }
            break;
          }
          if (pbVar9 <= out) goto LAB_0012dc87;
          *out = bVar4;
          out[1] = 0;
          in = in + 1;
          out = out + 2;
LAB_0012dc55:
        } while (in < pbVar8);
      }
      iVar1 = (int)out - iVar6;
LAB_0012dc63:
      *outlen = (int)out - iVar6;
      iVar7 = (int)in - iVar7;
    }
    *inlen = iVar7;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            out[1] = 0;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out[2] = d & 0xFF;
                out[3] = d >> 8;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}